

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O2

void __thiscall
CppUnit::Exception::Exception(Exception *this,Message *message,SourceLine *sourceLine)

{
  *(undefined ***)this = &PTR__Exception_0014f928;
  Message::Message(&this->m_message,message);
  SourceLine::SourceLine(&this->m_sourceLine,sourceLine);
  (this->m_whatMessage)._M_dataplus._M_p = (pointer)&(this->m_whatMessage).field_2;
  (this->m_whatMessage)._M_string_length = 0;
  (this->m_whatMessage).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Exception::Exception( const Message &message, 
                      const SourceLine &sourceLine )
    : m_message( message )
    , m_sourceLine( sourceLine )
    , m_whatMessage()
{
}